

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O2

int ReturnWithError(char *errorText,path *fname,FILE *fileToClose)

{
  int iVar1;
  string local_38;
  
  if (fileToClose != (FILE *)0x0) {
    fclose((FILE *)fileToClose);
  }
  std::filesystem::__cxx11::path::string(&local_38,fname);
  Error(errorText,local_38._M_dataplus._M_p,IF_FIRST);
  iVar1 = std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

static int ReturnWithError(const char* errorText, const std::filesystem::path & fname, FILE* fileToClose) {
	if (nullptr != fileToClose) fclose(fileToClose);
	Error(errorText, fname.string().c_str(), IF_FIRST);
	return 0;
}